

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsEarlyFragmentTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::FragmentOperations::anon_unknown_1::EarlyFragmentTest::createInstance
          (EarlyFragmentTest *this,Context *context)

{
  uint uVar1;
  InstanceInterface *pIVar2;
  VkPhysicalDevice pVVar3;
  TestInstance *pTVar4;
  NotSupportedError *this_00;
  uint uVar5;
  allocator<char> local_129;
  string local_128;
  VkPhysicalDeviceFeatures features;
  
  pIVar2 = Context::getInstanceInterface(context);
  pVVar3 = Context::getPhysicalDevice(context);
  (*pIVar2->_vptr_InstanceInterface[2])(pIVar2,pVVar3,&features);
  if (features.fragmentStoresAndAtomics != 0) {
    pTVar4 = (TestInstance *)operator_new(0x18);
    uVar1 = this->m_flags;
    pTVar4->m_context = context;
    pTVar4->_vptr_TestInstance = (_func_int **)&PTR__TestInstance_00c0b260;
    uVar5 = 1;
    if ((uVar1 & 1) == 0) {
      uVar5 = uVar1 & 2;
    }
    *(uint *)&pTVar4[1]._vptr_TestInstance = uVar5;
    *(bool *)((long)&pTVar4[1]._vptr_TestInstance + 4) = (uVar1 & 4) == 0;
    *(bool *)((long)&pTVar4[1]._vptr_TestInstance + 5) = (uVar1 & 8) == 0;
    return pTVar4;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"Missing required feature: fragmentStoresAndAtomics",&local_129);
  tcu::NotSupportedError::NotSupportedError(this_00,&local_128);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TestInstance* EarlyFragmentTest::createInstance (Context& context) const
{
	// Check required features
	{
		VkPhysicalDeviceFeatures features;
		context.getInstanceInterface().getPhysicalDeviceFeatures(context.getPhysicalDevice(), &features);

		// SSBO writes in fragment shader
		if (!features.fragmentStoresAndAtomics)
			throw tcu::NotSupportedError("Missing required feature: fragmentStoresAndAtomics");
	}

	return new EarlyFragmentTestInstance(context, m_flags);
}